

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseTableModuleField(WastParser *this,Module *module)

{
  bool bVar1;
  Result RVar2;
  pointer pTVar3;
  pointer pTVar4;
  pointer pEVar5;
  ExprList *this_00;
  reference pvVar6;
  size_type sVar7;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_258;
  Enum local_250;
  Enum local_24c;
  unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
  local_248;
  unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> local_240;
  Enum local_234;
  undefined1 local_230 [8];
  ExprList elem_expr;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_210;
  Location local_208;
  Location local_1e8;
  undefined1 local_1c8 [8];
  Const offset;
  Var local_158;
  ElemSegment *local_110;
  ElemSegment *elem_segment;
  __single_object elem_segment_field;
  Type local_f4;
  Type elem_type;
  Table *table;
  __single_object field_1;
  Location local_d0;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_b0;
  __single_object field;
  undefined1 local_98 [8];
  __single_object import;
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  GetLocation((Location *)local_48,this);
  RVar2 = Expect(this,Table);
  bVar1 = Failed(RVar2);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    return (Result)this_local._4_4_;
  }
  std::__cxx11::string::string((string *)&export_fields.size_);
  ParseBindVarOpt(this,(string *)&export_fields.size_);
  intrusive_list<wabt::ModuleField>::intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
  .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
  super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_ =
       ParseInlineExports(this,(ModuleFieldList *)&stack0xffffffffffffff78,Table);
  bVar1 = Failed(import._M_t.
                 super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>
                 .super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._4_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
    import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
    _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
    super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    goto LAB_0020d06f;
  }
  bVar1 = PeekMatchLpar(this,Import);
  if (bVar1) {
    CheckImportOrdering(this,module);
    std::make_unique<wabt::TableImport,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
    pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::get
                       ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                        local_98);
    RVar2 = ParseInlineImport(this,(Import *)pTVar3);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
               operator->((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                          local_98);
      RVar2 = ParseLimitsIndex(this,&(pTVar3->table).elem_limits);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.
        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
        super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
                 operator->((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
                             *)local_98);
        field._M_t.
        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
        ._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_ =
             ParseLimits(this,&(pTVar3->table).elem_limits);
        bVar1 = Failed(field._M_t.
                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._4_4_);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          pTVar3 = std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::
                   operator->((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
                               *)local_98);
          field._M_t.
          super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
          .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_ =
               ParseRefType(this,&(pTVar3->table).elem_type);
          bVar1 = Failed(field._M_t.
                         super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl._0_4_
                        );
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            GetLocation(&local_d0,this);
            std::
            make_unique<wabt::ImportModuleField,std::unique_ptr<wabt::TableImport,std::default_delete<wabt::TableImport>>,wabt::Location>
                      ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)
                       &local_b0,(Location *)local_98);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                          *)&field_1,&local_b0);
            Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                        *)&field_1);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                           *)&field_1);
            std::unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
            ::~unique_ptr(&local_b0);
            import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
          }
        }
      }
    }
    std::unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_>::~unique_ptr
              ((unique_ptr<wabt::TableImport,_std::default_delete<wabt::TableImport>_> *)local_98);
  }
  else {
    std::make_unique<wabt::TableModuleField,wabt::Location&,std::__cxx11::string&>
              ((Location *)&table,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    pTVar4 = std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
             operator->((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                         *)&table);
    register0x00000000 = &pTVar4->table;
    elem_type.enum_ = (Enum)ParseLimitsIndex(this,&(pTVar4->table).elem_limits);
    bVar1 = Failed((Result)elem_type.enum_);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      bVar1 = PeekMatch(this,First_Type,0);
      if (bVar1) {
        RVar2 = ParseRefType(this,&local_f4);
        bVar1 = Failed(RVar2);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          elem_segment_field._M_t.
          super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
          ._M_t.
          super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
          .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._4_4_ =
               Expect(this,Lpar);
          bVar1 = Failed(elem_segment_field._M_t.
                         super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                         .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl.
                         _4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            elem_segment_field._M_t.
            super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
            ._M_t.
            super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
            .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>._M_head_impl._0_4_ =
                 Expect(this,Elem);
            bVar1 = Failed(elem_segment_field._M_t.
                           super___uniq_ptr_impl<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wabt::ElemSegmentModuleField_*,_std::default_delete<wabt::ElemSegmentModuleField>_>
                           .super__Head_base<0UL,_wabt::ElemSegmentModuleField_*,_false>.
                           _M_head_impl._0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
              .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
              super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              std::make_unique<wabt::ElemSegmentModuleField,wabt::Location&>
                        ((Location *)&elem_segment);
              pEVar5 = std::
                       unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                       ::operator->((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                                     *)&elem_segment);
              local_110 = &pEVar5->elem_segment;
              sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size
                                (&module->tables);
              GetLocation((Location *)(offset.nan_ + 2),this);
              Var::Var(&local_158,(Index)sVar7,(Location *)(offset.nan_ + 2));
              Var::operator=(&local_110->table_var,&local_158);
              Var::~Var(&local_158);
              if (((stack0xffffffffffffff18->elem_limits).is_64 & 1U) == 0) {
                Location::Location(&local_208);
                Const::I32((Const *)local_1c8,0,&local_208);
              }
              else {
                Location::Location(&local_1e8);
                Const::I64((Const *)local_1c8,0,&local_1e8);
              }
              this_00 = &local_110->offset;
              std::make_unique<wabt::ConstExpr,wabt::Const&>((Const *)&elem_expr.size_);
              std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
              unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
                        ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_210,
                         (unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)
                         &elem_expr.size_);
              intrusive_list<wabt::Expr>::push_back(this_00,&local_210);
              std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_210)
              ;
              std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
                        ((unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)
                         &elem_expr.size_);
              pvVar6 = intrusive_list<wabt::Expr>::back(&local_110->offset);
              (pvVar6->loc).filename._M_len = (size_t)local_48;
              (pvVar6->loc).filename._M_str = (char *)loc.filename._M_len;
              (pvVar6->loc).field_1.field_1.offset = (size_t)loc.filename._M_str;
              ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
              ((long)&(pvVar6->loc).field_1 + 8))->offset = (size_t)loc.field_1.field_1.offset;
              local_110->elem_type = local_f4;
              intrusive_list<wabt::Expr>::intrusive_list((intrusive_list<wabt::Expr> *)local_230);
              bVar1 = ParseElemExprOpt(this,(ExprList *)local_230);
              if (bVar1) {
                std::
                vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                ::push_back(&local_110->elem_exprs,(value_type *)local_230);
                ParseElemExprListOpt(this,&local_110->elem_exprs);
              }
              else {
                ParseElemExprVarListOpt(this,&local_110->elem_exprs);
              }
              local_234 = (Enum)Expect(this,Rpar);
              bVar1 = Failed((Result)local_234);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
              }
              else {
                sVar7 = std::
                        vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                        ::size(&local_110->elem_exprs);
                (stack0xffffffffffffff18->elem_limits).initial = sVar7;
                sVar7 = std::
                        vector<wabt::intrusive_list<wabt::Expr>,_std::allocator<wabt::intrusive_list<wabt::Expr>_>_>
                        ::size(&local_110->elem_exprs);
                (stack0xffffffffffffff18->elem_limits).max = sVar7;
                (stack0xffffffffffffff18->elem_limits).has_max = true;
                stack0xffffffffffffff18->elem_type = local_f4;
                std::
                unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                unique_ptr(&local_240,
                           (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                            *)&table);
                Module::AppendField(module,&local_240);
                std::
                unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
                ~unique_ptr(&local_240);
                std::
                unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                ::unique_ptr(&local_248,
                             (unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                              *)&elem_segment);
                Module::AppendField(module,&local_248);
                std::
                unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                ::~unique_ptr(&local_248);
              }
              import._M_t.
              super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
              .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
              super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._1_3_ = 0;
              import._M_t.
              super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t
              .super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
              super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_1_ = bVar1;
              intrusive_list<wabt::Expr>::~intrusive_list((intrusive_list<wabt::Expr> *)local_230);
              std::
              unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
              ::~unique_ptr((unique_ptr<wabt::ElemSegmentModuleField,_std::default_delete<wabt::ElemSegmentModuleField>_>
                             *)&elem_segment);
              if ((uint)import._M_t.
                        super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>
                        .super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl == 0)
              goto LAB_0020cfbb;
            }
          }
        }
      }
      else {
        local_24c = (Enum)ParseLimits(this,&stack0xffffffffffffff18->elem_limits);
        bVar1 = Failed((Result)local_24c);
        if (bVar1) {
          Result::Result((Result *)((long)&this_local + 4),Error);
          import._M_t.
          super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
          super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
          super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
        }
        else {
          local_250 = (Enum)ParseRefType(this,&stack0xffffffffffffff18->elem_type);
          bVar1 = Failed((Result)local_250);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
            unique_ptr(&local_258,
                       (unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>
                        *)&table);
            Module::AppendField(module,&local_258);
            std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
            ~unique_ptr(&local_258);
LAB_0020cfbb:
            import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 0;
          }
        }
      }
    }
    std::unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_>::
    ~unique_ptr((unique_ptr<wabt::TableModuleField,_std::default_delete<wabt::TableModuleField>_> *)
                &table);
  }
  if ((uint)import._M_t.
            super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
            super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl == 0) {
    sVar7 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::size(&module->tables);
    anon_unknown_1::AppendInlineExportFields
              (module,(ModuleFieldList *)&stack0xffffffffffffff78,(int)sVar7 - 1);
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
    else {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      import._M_t.super___uniq_ptr_impl<wabt::TableImport,_std::default_delete<wabt::TableImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::TableImport_*,_std::default_delete<wabt::TableImport>_>.
      super__Head_base<0UL,_wabt::TableImport_*,_false>._M_head_impl._0_4_ = 1;
    }
  }
LAB_0020d06f:
  intrusive_list<wabt::ModuleField>::~intrusive_list
            ((intrusive_list<wabt::ModuleField> *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)&export_fields.size_);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseTableModuleField(Module* module) {
  WABT_TRACE(ParseTableModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Table);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Table));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TableImport>(name);
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseLimitsIndex(&import->table.elem_limits));
    CHECK_RESULT(ParseLimits(&import->table.elem_limits));
    CHECK_RESULT(ParseRefType(&import->table.elem_type));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TableModuleField>(loc, name);
    auto& table = field->table;
    CHECK_RESULT(ParseLimitsIndex(&table.elem_limits));
    if (PeekMatch(TokenType::ValueType)) {
      Type elem_type;
      CHECK_RESULT(ParseRefType(&elem_type));

      EXPECT(Lpar);
      EXPECT(Elem);

      auto elem_segment_field = std::make_unique<ElemSegmentModuleField>(loc);
      ElemSegment& elem_segment = elem_segment_field->elem_segment;
      elem_segment.table_var = Var(module->tables.size(), GetLocation());
      auto offset = table.elem_limits.is_64 ? Const::I64(0) : Const::I32(0);
      elem_segment.offset.push_back(std::make_unique<ConstExpr>(offset));
      elem_segment.offset.back().loc = loc;
      elem_segment.elem_type = elem_type;
      // Syntax is either an optional list of var (legacy), or a non-empty list
      // of elem expr.
      ExprList elem_expr;
      if (ParseElemExprOpt(&elem_expr)) {
        elem_segment.elem_exprs.push_back(std::move(elem_expr));
        // Parse the rest.
        ParseElemExprListOpt(&elem_segment.elem_exprs);
      } else {
        ParseElemExprVarListOpt(&elem_segment.elem_exprs);
      }
      EXPECT(Rpar);

      table.elem_limits.initial = elem_segment.elem_exprs.size();
      table.elem_limits.max = elem_segment.elem_exprs.size();
      table.elem_limits.has_max = true;
      table.elem_type = elem_type;
      module->AppendField(std::move(field));
      module->AppendField(std::move(elem_segment_field));
    } else {
      CHECK_RESULT(ParseLimits(&table.elem_limits));
      CHECK_RESULT(ParseRefType(&table.elem_type));
      module->AppendField(std::move(field));
    }
  }

  AppendInlineExportFields(module, &export_fields, module->tables.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}